

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O0

double __thiscall ColorToGray::numericValue(ColorToGray *this,Token *token)

{
  string *psVar1;
  double dVar2;
  allocator<char> local_49;
  string local_48 [32];
  QPDFObjectHandle local_28;
  Token *local_18;
  Token *token_local;
  ColorToGray *this_local;
  
  local_18 = token;
  token_local = (Token *)this;
  psVar1 = QPDFTokenizer::Token::getValue_abi_cxx11_(token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
  QPDFObjectHandle::parse((string *)&local_28,(string *)psVar1);
  dVar2 = (double)QPDFObjectHandle::getNumericValue();
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return dVar2;
}

Assistant:

double
ColorToGray::numericValue(QPDFTokenizer::Token const& token)
{
    return QPDFObjectHandle::parse(token.getValue()).getNumericValue();
}